

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O2

int ssh_cfg_info(Backend *be)

{
  int iVar1;
  
  iVar1 = *(int *)&be[10].vt;
  if (iVar1 != 0) {
    if (*(char *)&be[4].vt != '\0') {
      iVar1 = -1;
    }
    return iVar1;
  }
  return 0;
}

Assistant:

static int ssh_cfg_info(Backend *be)
{
    Ssh *ssh = container_of(be, Ssh, backend);
    if (ssh->version == 0)
        return 0; /* don't know yet */
    else if (ssh->bare_connection)
        return -1;
    else
        return ssh->version;
}